

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoLinear.cpp
# Opt level: O1

int __thiscall pzgeom::TPZGeoLinear::ClassId(TPZGeoLinear *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZGeoLinear","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZNodeRep<2,_pztopology::TPZLine>::ClassId
                    (&this->super_TPZNodeRep<2,_pztopology::TPZLine>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoLinear::ClassId() const{
        return Hash("TPZGeoLinear") ^ TPZNodeRep<2, pztopology::TPZLine>::ClassId() << 1;
    }